

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_aes_crypt_ofb
              (mbedtls_aes_context *ctx,size_t length,size_t *iv_off,uchar *iv,uchar *input,
              uchar *output)

{
  int iVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar2 = *iv_off;
  iVar1 = -0x21;
  if (uVar2 < 0x10) {
    if (length != 0) {
      sVar3 = 0;
      do {
        if ((uVar2 == 0) && (iVar1 = mbedtls_aes_crypt_ecb(ctx,1,iv,iv), iVar1 != 0)) {
          return iVar1;
        }
        output[sVar3] = iv[uVar2] ^ input[sVar3];
        uVar2 = (ulong)((int)uVar2 + 1U & 0xf);
        sVar3 = sVar3 + 1;
      } while (length != sVar3);
    }
    *iv_off = uVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mbedtls_aes_crypt_ofb( mbedtls_aes_context *ctx,
                           size_t length,
                           size_t *iv_off,
                           unsigned char iv[16],
                           const unsigned char *input,
                           unsigned char *output )
{
    int ret = 0;
    size_t n;

    AES_VALIDATE_RET( ctx != NULL );
    AES_VALIDATE_RET( iv_off != NULL );
    AES_VALIDATE_RET( iv != NULL );
    AES_VALIDATE_RET( input != NULL );
    AES_VALIDATE_RET( output != NULL );

    n = *iv_off;

    if( n > 15 )
        return( MBEDTLS_ERR_AES_BAD_INPUT_DATA );

    while( length-- )
    {
        if( n == 0 )
        {
            ret = mbedtls_aes_crypt_ecb( ctx, MBEDTLS_AES_ENCRYPT, iv, iv );
            if( ret != 0 )
                goto exit;
        }
        *output++ =  *input++ ^ iv[n];

        n = ( n + 1 ) & 0x0F;
    }

    *iv_off = n;

exit:
    return( ret );
}